

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Vector<unsigned_int,_2> gl4cts::Math::convertBvecToUvec<2>(Vector<bool,_2> *src)

{
  GLint i;
  long lVar1;
  Vector<unsigned_int,_2> *result;
  uint in_RDI [2];
  
  *(undefined8 *)in_RDI = 0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(uint *)((long)in_RDI + lVar1 * 4) = (uint)src->m_data[lVar1];
  }
  return (Vector<unsigned_int,_2>)in_RDI;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> convertBvecToUvec(const tcu::Vector<bool, Size>& src)
{
	tcu::Vector<glw::GLuint, Size> result;

	for (glw::GLint i = 0; i < Size; ++i)
	{
		if (GL_FALSE != src[i])
		{
			result[i] = 1;
		}
		else
		{
			result[i] = 0;
		}
	}

	return result;
}